

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall gl4cts::ShaderSubroutine::FunctionalTest12::testAtomic(FunctionalTest12 *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  GLuint subroutine_index;
  GLuint subroutine_index_00;
  GLuint subroutine_index_01;
  socklen_t sVar4;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar5;
  framebuffer framebuffer;
  buffer atomic_buffer;
  vertexArray vao;
  texture color_texture;
  program program;
  
  framebuffer.m_context = (this->super_TestCase).m_context;
  atomic_buffer.m_id = 0;
  color_texture.m_id = 0;
  framebuffer.m_id = 0;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  vao.m_id = 0;
  sVar4 = 0x16adf89;
  iVar5 = 0;
  atomic_buffer.m_context = framebuffer.m_context;
  vao.m_context = framebuffer.m_context;
  color_texture.m_context = framebuffer.m_context;
  program.m_context = framebuffer.m_context;
  Utils::program::build
            (&program,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_atomic_counters : require\n#extension GL_ARB_shader_subroutine      : require\n\nprecision highp float;\n\nlayout(location = 0) out uint out_color;\n\nlayout(binding = 0, offset = 8) uniform atomic_uint one;\nlayout(binding = 0, offset = 4) uniform atomic_uint two;\nlayout(binding = 0, offset = 0) uniform atomic_uint three;\n\nsubroutine void atomic_routine(void)\n;\nsubroutine(atomic_routine) void increment_two(void)\n{\n    out_color = atomicCounterIncrement(two);\n}\n\nsubroutine(atomic_routine) void decrement_three(void)\n{\n    out_color = atomicCounterDecrement(three);\n}\n\nsubroutine(atomic_routine) void read_one(void)\n{\n    out_color = atomicCounter(one);\n}\n\nsubroutine uniform atomic_routine routine;\n\nvoid main()\n{\n    routine();\n}\n\n"
             ,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
             ,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
             ,(GLchar **)0x0,0,false);
  Utils::program::use(&program);
  Utils::vertexArray::generate(&vao);
  Utils::vertexArray::bind(&vao,iVar5,__addr,sVar4);
  Utils::texture::create(&color_texture,0x10,0x10,0x8236);
  Utils::buffer::generate(&atomic_buffer);
  Utils::buffer::update(&atomic_buffer,0x92c0,0xc,testAtomic::atomic_buffer_data,0x88e4);
  iVar5 = 0x92c0;
  sVar4 = 0;
  Utils::buffer::bindRange(&atomic_buffer,0x92c0,0,0,0xc);
  Utils::framebuffer::generate(&framebuffer);
  Utils::framebuffer::bind(&framebuffer,iVar5,__addr_00,sVar4);
  Utils::framebuffer::attachTexture(&framebuffer,0x8ce0,color_texture.m_id,0x10,0x10);
  Utils::framebuffer::clearColor(&framebuffer,0.0,0.0,0.0,0.0);
  Utils::framebuffer::clear(&framebuffer,0x4000);
  subroutine_index = Utils::program::getSubroutineIndex(&program,"increment_two",0x8b30);
  subroutine_index_00 = Utils::program::getSubroutineIndex(&program,"decrement_three",0x8b30);
  subroutine_index_01 = Utils::program::getSubroutineIndex(&program,"read_one",0x8b30);
  bVar1 = testAtomicDraw(this,subroutine_index,testAtomic::expected_incremented_two);
  bVar2 = testAtomicDraw(this,subroutine_index_00,testAtomic::expected_decremented_three);
  bVar3 = testAtomicDraw(this,subroutine_index_01,testAtomic::expected_read_one);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::program::~program(&program);
  Utils::framebuffer::~framebuffer(&framebuffer);
  Utils::texture::~texture(&color_texture);
  Utils::buffer::~buffer(&atomic_buffer);
  return (bVar1 && bVar2) && bVar3;
}

Assistant:

bool FunctionalTest12::testAtomic()
{
	static const GLchar* fragment_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_atomic_counters : require\n"
												"#extension GL_ARB_shader_subroutine      : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(location = 0) out uint out_color;\n"
												"\n"
												"layout(binding = 0, offset = 8) uniform atomic_uint one;\n"
												"layout(binding = 0, offset = 4) uniform atomic_uint two;\n"
												"layout(binding = 0, offset = 0) uniform atomic_uint three;\n"
												"\n"
												"subroutine void atomic_routine(void)\n;"
												"\n"
												"subroutine(atomic_routine) void increment_two(void)\n"
												"{\n"
												"    out_color = atomicCounterIncrement(two);\n"
												"}\n"
												"\n"
												"subroutine(atomic_routine) void decrement_three(void)\n"
												"{\n"
												"    out_color = atomicCounterDecrement(three);\n"
												"}\n"
												"\n"
												"subroutine(atomic_routine) void read_one(void)\n"
												"{\n"
												"    out_color = atomicCounter(one);\n"
												"}\n"
												"\n"
												"subroutine uniform atomic_routine routine;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    routine();\n"
												"}\n"
												"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[] = { "increment_two", "decrement_three", "read_one" };

	/* Test data */
	static const glw::GLuint atomic_buffer_data[] = { m_texture_width * m_texture_height,
													  m_texture_width * m_texture_height,
													  m_texture_width * m_texture_height };

	static const glw::GLuint expected_incremented_two[] = { atomic_buffer_data[0], 2 * atomic_buffer_data[1],
															atomic_buffer_data[2] };

	static const glw::GLuint expected_decremented_three[] = { 0, expected_incremented_two[1],
															  expected_incremented_two[2] };

	static const glw::GLuint expected_read_one[] = { expected_decremented_three[0], expected_decremented_three[1],
													 expected_decremented_three[2] };

	/* GL objects */
	Utils::buffer	  atomic_buffer(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	color_texture.create(m_texture_width, m_texture_height, GL_R32UI);

	atomic_buffer.generate();
	atomic_buffer.update(GL_ATOMIC_COUNTER_BUFFER, sizeof(atomic_buffer_data), (GLvoid*)atomic_buffer_data,
						 GL_STATIC_DRAW);
	atomic_buffer.bindRange(GL_ATOMIC_COUNTER_BUFFER, 0 /* index */, 0 /* offset */, sizeof(atomic_buffer_data));

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);
	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
	framebuffer.clear(GL_COLOR_BUFFER_BIT);

	/* Subroutine indices */
	GLuint increment_two   = program.getSubroutineIndex(subroutine_names[0], GL_FRAGMENT_SHADER);
	GLuint decrement_three = program.getSubroutineIndex(subroutine_names[1], GL_FRAGMENT_SHADER);
	GLuint read_one		   = program.getSubroutineIndex(subroutine_names[2], GL_FRAGMENT_SHADER);

	/* Test */
	bool result = true;

	if (false == testAtomicDraw(increment_two, expected_incremented_two))
	{
		result = false;
	}

	if (false == testAtomicDraw(decrement_three, expected_decremented_three))
	{
		result = false;
	}

	if (false == testAtomicDraw(read_one, expected_read_one))
	{
		result = false;
	}

	/* Done */
	return result;
}